

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

bool __thiscall
QDockAreaLayoutInfo::restoreState
          (QDockAreaLayoutInfo *this,QDataStream *stream,QList<QDockWidget_*> *widgets,bool testing)

{
  QRect rect;
  bool bVar1;
  qsizetype qVar2;
  QPlaceHolderItem *_placeHolderItem;
  QDataStream *pQVar3;
  QWidget *this_00;
  long lVar4;
  undefined1 in_CL;
  QDataStream *in_RDX;
  QDockAreaLayoutInfo *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutItem *lastItem;
  bool drawer;
  QPlaceHolderItem *placeHolder;
  int j;
  QDockWidget *widget;
  int i;
  int dummy_3;
  int dummy_2;
  int h_1;
  int w_1;
  int y_1;
  int x_1;
  int dummy_1;
  int h;
  int w;
  int y;
  int x;
  int dummy;
  uchar flags;
  QString name;
  uchar nextMarker;
  int cnt;
  uchar orientation;
  int index;
  uchar marker;
  QDockAreaLayoutItem item_2;
  QDockAreaLayoutItem item_1;
  QDockAreaLayoutItem item;
  int in_stack_fffffffffffffe18;
  DockWidgetArea in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  QRect *in_stack_fffffffffffffe28;
  QDockAreaLayoutItem *in_stack_fffffffffffffe30;
  QDockAreaLayoutInfo *in_stack_fffffffffffffe38;
  QDockAreaLayoutInfo *in_stack_fffffffffffffe40;
  QDockAreaLayoutInfo *in_stack_fffffffffffffe48;
  QDockAreaLayoutInfo *in_stack_fffffffffffffe70;
  int local_164;
  QDockAreaLayoutInfo *r;
  QDockAreaLayoutInfo *pQVar5;
  undefined4 in_stack_fffffffffffffea8;
  Representation in_stack_fffffffffffffeac;
  undefined1 testing_00;
  uint uVar6;
  int iVar7;
  undefined3 in_stack_fffffffffffffeb4;
  uint uVar8;
  byte local_12d;
  int local_12c [6];
  QRect local_114;
  int local_104 [5];
  undefined8 local_f0;
  undefined8 local_e8;
  int local_e0 [10];
  int local_b8;
  byte local_b1;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char local_91;
  int local_90;
  byte local_89;
  int local_88;
  char local_81;
  QDockAreaLayoutItem local_80;
  QDockAreaLayoutItem local_58;
  QDockAreaLayoutItem local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = CONCAT13(in_CL,in_stack_fffffffffffffeb4) & 0x1ffffff;
  local_81 = -0x56;
  QDataStream::operator>>
            ((QDataStream *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (quint8 *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  if ((local_81 == -6) || (local_81 == -4)) {
    *(bool *)(in_RDI + 0xb) = local_81 == -6;
    local_88 = -1;
    if ((*(byte *)(in_RDI + 0xb) & 1) != 0) {
      QDataStream::operator>>((QDataStream *)in_RSI,&local_88);
    }
    local_89 = 0xaa;
    QDataStream::operator>>
              ((QDataStream *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (quint8 *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    *(uint *)((long)in_RDI + 0x24) = (uint)local_89;
    local_90 = -0x55555556;
    QDataStream::operator>>((QDataStream *)in_RSI,&local_90);
    for (iVar7 = 0; iVar7 < local_90; iVar7 = iVar7 + 1) {
      local_91 = -0x56;
      QDataStream::operator>>
                ((QDataStream *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (quint8 *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      if (local_91 == -5) {
        local_b0 = &DAT_aaaaaaaaaaaaaaaa;
        local_a8 = &DAT_aaaaaaaaaaaaaaaa;
        local_a0 = &DAT_aaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x57556c);
        local_b1 = 0xaa;
        ::operator>>((QDataStream *)in_RSI,(QString *)&local_b0);
        QDataStream::operator>>
                  ((QDataStream *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   (quint8 *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        bVar1 = QString::isEmpty((QString *)0x5755a6);
        if (bVar1) {
          local_b8 = -0x55555556;
          pQVar3 = (QDataStream *)QDataStream::operator>>((QDataStream *)in_RSI,&local_b8);
          pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,&local_b8);
          pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,&local_b8);
          QDataStream::operator>>(pQVar3,&local_b8);
          in_stack_fffffffffffffeac.m_i = 4;
        }
        else {
          r = (QDockAreaLayoutInfo *)0x0;
          local_164 = 0;
          while( true ) {
            in_stack_fffffffffffffe70 = (QDockAreaLayoutInfo *)(long)local_164;
            qVar2 = QList<QDockWidget_*>::size((QList<QDockWidget_*> *)in_RDX);
            if (qVar2 <= (long)in_stack_fffffffffffffe70) break;
            QList<QDockWidget_*>::at
                      ((QList<QDockWidget_*> *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
            QObject::objectName();
            bVar1 = ::operator==((QString *)
                                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
            QString::~QString((QString *)0x575699);
            if (bVar1) {
              r = (QDockAreaLayoutInfo *)
                  QList<QDockWidget_*>::takeAt
                            ((QList<QDockWidget_*> *)in_stack_fffffffffffffe30,
                             (qsizetype)in_stack_fffffffffffffe28);
              break;
            }
            local_164 = local_164 + 1;
          }
          if (r == (QDockAreaLayoutInfo *)0x0) {
            _placeHolderItem = (QPlaceHolderItem *)operator_new(0x30);
            QPlaceHolderItem::QPlaceHolderItem
                      ((QPlaceHolderItem *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
            memset(&local_30,0xaa,0x28);
            QDockAreaLayoutItem::QDockAreaLayoutItem(&local_30,_placeHolderItem);
            QString::operator=((QString *)_placeHolderItem,(QString *)&local_b0);
            _placeHolderItem->window = (local_b1 & 2) != 0;
            _placeHolderItem->hidden = (bool)(((local_b1 & 1) != 0 ^ 0xffU) & 1);
            if ((_placeHolderItem->window & 1U) == 0) {
              local_104[4] = 0xaaaaaaaa;
              pQVar3 = (QDataStream *)QDataStream::operator>>((QDataStream *)in_RSI,&local_30.pos);
              pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,&local_30.size);
              pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,local_104 + 4);
              QDataStream::operator>>(pQVar3,local_104 + 4);
            }
            else {
              local_e0[3] = 0xaaaaaaaa;
              local_e0[2] = 0xaaaaaaaa;
              local_e0[1] = 0xaaaaaaaa;
              local_e0[0] = -0x55555556;
              pQVar3 = (QDataStream *)QDataStream::operator>>((QDataStream *)in_RSI,local_e0 + 3);
              pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,local_e0 + 2);
              pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,local_e0 + 1);
              QDataStream::operator>>(pQVar3,local_e0);
              QRect::QRect(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                           in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                           in_stack_fffffffffffffe18);
              (_placeHolderItem->topLevelRect).x1 = (Representation)(undefined4)local_f0;
              (_placeHolderItem->topLevelRect).y1 = (Representation)local_f0._4_4_;
              (_placeHolderItem->topLevelRect).x2 = (Representation)(undefined4)local_e8;
              (_placeHolderItem->topLevelRect).y2 = (Representation)local_e8._4_4_;
            }
            if (local_30.size != -1) {
              local_30.flags = local_30.flags | 2;
            }
            if ((uVar8 & 0x1000000) == 0) {
              QList<QDockAreaLayoutItem>::append
                        ((QList<QDockAreaLayoutItem> *)
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                         (parameter_type)
                         CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
            }
            QDockAreaLayoutItem::~QDockAreaLayoutItem(in_stack_fffffffffffffe30);
          }
          else {
            memset(&local_58,0xaa,0x28);
            this_00 = (QWidget *)operator_new(0x18);
            QDockWidgetItem::QDockWidgetItem
                      ((QDockWidgetItem *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       (QDockWidget *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
            ;
            QDockAreaLayoutItem::QDockAreaLayoutItem(&local_58,(QLayoutItem *)this_00);
            if ((local_b1 & 2) == 0) {
              local_12c[1] = 0xaaaaaaaa;
              pQVar3 = (QDataStream *)QDataStream::operator>>((QDataStream *)in_RSI,&local_58.pos);
              pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,&local_58.size);
              pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,local_12c + 1);
              QDataStream::operator>>(pQVar3,local_12c + 1);
              if ((uVar8 & 0x1000000) == 0) {
                QList<QDockAreaLayoutItem>::append
                          ((QList<QDockAreaLayoutItem> *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (parameter_type)
                           CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
                QDockWidget::setFloating
                          ((QDockWidget *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           SUB41(in_stack_fffffffffffffe1c >> 0x18,0));
                in_stack_fffffffffffffe48 = r;
                (**(code **)(*(long *)&r->sep + 0x68))(r,(local_b1 & 1) != 0);
                toDockWidgetArea(*(DockPosition *)(in_RDI + 4));
                QDockWidget::dockLocationChanged((QDockWidget *)0x575b94,in_stack_fffffffffffffe1c);
              }
            }
            else {
              if ((uVar8 & 0x1000000) == 0) {
                QWidget::hide((QWidget *)0x575966);
                QDockWidget::setFloating
                          ((QDockWidget *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           SUB41(in_stack_fffffffffffffe1c >> 0x18,0));
              }
              local_104[3] = 0xaaaaaaaa;
              local_104[2] = 0xaaaaaaaa;
              local_104[1] = 0xaaaaaaaa;
              local_104[0] = -0x55555556;
              pQVar3 = (QDataStream *)QDataStream::operator>>((QDataStream *)in_RSI,local_104 + 3);
              pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,local_104 + 2);
              pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,local_104 + 1);
              QDataStream::operator>>(pQVar3,local_104);
              pQVar5 = r;
              if ((uVar8 & 0x1000000) == 0) {
                QRect::QRect(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                             in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                             in_stack_fffffffffffffe18);
                rect.x2.m_i = in_stack_fffffffffffffea8;
                rect._0_8_ = pQVar5;
                rect.y2.m_i = in_stack_fffffffffffffeac.m_i;
                local_114 = QDockAreaLayout::constrainedRect
                                      (rect,(QWidget *)in_stack_fffffffffffffe38);
                QWidget::setGeometry(this_00,(QRect *)r);
              }
              if ((uVar8 & 0x1000000) == 0) {
                (**(code **)(*(long *)&pQVar5->sep + 0x68))(pQVar5,(local_b1 & 1) != 0);
                QList<QDockAreaLayoutItem>::append
                          ((QList<QDockAreaLayoutItem> *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (parameter_type)
                           CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
              }
            }
            if ((uVar8 & 0x1000000) != 0) {
              in_stack_fffffffffffffe40 = (QDockAreaLayoutInfo *)local_58.widgetItem;
              if ((QDockAreaLayoutInfo *)local_58.widgetItem != (QDockAreaLayoutInfo *)0x0) {
                (**(code **)((long)(local_58.widgetItem)->_vptr_QLayoutItem + 8))();
                in_stack_fffffffffffffe40 = (QDockAreaLayoutInfo *)local_58.widgetItem;
              }
              local_58.widgetItem = (QLayoutItem *)0x0;
            }
            QDockAreaLayoutItem::~QDockAreaLayoutItem(in_stack_fffffffffffffe30);
          }
          in_stack_fffffffffffffeac.m_i = 0;
        }
        QString::~QString((QString *)0x575bef);
      }
      else {
        if (local_91 != -4) {
          local_12d = 0;
          goto LAB_00575e67;
        }
        local_12c[0] = -0x55555556;
        memset(&local_80,0xaa,0x28);
        testing_00 = (undefined1)((uint)in_stack_fffffffffffffeac.m_i >> 0x18);
        in_stack_fffffffffffffe38 = (QDockAreaLayoutInfo *)operator_new(0x70);
        QDockAreaLayoutInfo(in_stack_fffffffffffffe40,(int *)in_stack_fffffffffffffe38,
                            (DockPosition)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                            (Orientation)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            (QMainWindow *)
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        QDockAreaLayoutItem::QDockAreaLayoutItem(&local_80,in_stack_fffffffffffffe38);
        pQVar3 = (QDataStream *)QDataStream::operator>>((QDataStream *)in_RSI,&local_80.pos);
        pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,&local_80.size);
        pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,local_12c);
        QDataStream::operator>>(pQVar3,local_12c);
        if ((uVar8 & 0x1000000) == 0) {
          QList<QDockAreaLayoutItem>::append
                    ((QList<QDockAreaLayoutItem> *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     (parameter_type)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        }
        if ((uVar8 & 0x1000000) == 0) {
          in_stack_fffffffffffffe30 =
               QList<QDockAreaLayoutItem>::last
                         ((QList<QDockAreaLayoutItem> *)
                          CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        }
        else {
          in_stack_fffffffffffffe30 = &local_80;
        }
        bVar1 = restoreState(in_RSI,in_RDX,(QList<QDockWidget_*> *)CONCAT44(uVar8,iVar7),
                             (bool)testing_00);
        if (!bVar1) {
          local_12d = 0;
        }
        uVar6 = (uint)!bVar1;
        QDockAreaLayoutItem::~QDockAreaLayoutItem(in_stack_fffffffffffffe30);
        if (uVar6 != 0) goto LAB_00575e67;
        in_stack_fffffffffffffeac.m_i = 0;
      }
    }
    if ((((uVar8 & 0x1000000) == 0) && ((*(byte *)(in_RDI + 0xb) & 1) != 0)) && (-1 < local_88)) {
      lVar4 = (long)local_88;
      qVar2 = QList<QDockAreaLayoutItem>::size((QList<QDockAreaLayoutItem> *)(in_RDI + 8));
      if (lVar4 < qVar2) {
        updateTabBar((QDockAreaLayoutInfo *)CONCAT44(uVar8,iVar7));
        QList<QDockAreaLayoutItem>::at
                  ((QList<QDockAreaLayoutItem> *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        tabId((QDockAreaLayoutItem *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        setCurrentTabId(in_stack_fffffffffffffe48,(quintptr)in_stack_fffffffffffffe40);
      }
    }
    if (((uVar8 & 0x1000000) == 0) && (*(int *)*in_RDI == 1)) {
      updateSeparatorWidgets(in_stack_fffffffffffffe70);
    }
    local_12d = 1;
  }
  else {
    local_12d = 0;
  }
LAB_00575e67:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_12d & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QDockAreaLayoutInfo::restoreState(QDataStream &stream, QList<QDockWidget*> &widgets, bool testing)
{
    uchar marker;
    stream >> marker;
    if (marker != TabMarker && marker != SequenceMarker)
        return false;

#if QT_CONFIG(tabbar)
    tabbed = marker == TabMarker;

    int index = -1;
    if (tabbed)
        stream >> index;
#endif

    uchar orientation;
    stream >> orientation;
    o = static_cast<Qt::Orientation>(orientation);

    int cnt;
    stream >> cnt;

    for (int i = 0; i < cnt; ++i) {
        uchar nextMarker;
        stream >> nextMarker;
        if (nextMarker == WidgetMarker) {
            QString name;
            uchar flags;
            stream >> name >> flags;
            if (name.isEmpty()) {
                int dummy;
                stream >> dummy >> dummy >> dummy >> dummy;
                continue;
            }

            QDockWidget *widget = nullptr;
            for (int j = 0; j < widgets.size(); ++j) {
                if (widgets.at(j)->objectName() == name) {
                    widget = widgets.takeAt(j);
                    break;
                }
            }

            if (widget == nullptr) {
                QPlaceHolderItem *placeHolder = new QPlaceHolderItem;
                QDockAreaLayoutItem item(placeHolder);

                placeHolder->objectName = name;
                placeHolder->window = flags & StateFlagFloating;
                placeHolder->hidden = !(flags & StateFlagVisible);
                if (placeHolder->window) {
                    int x, y, w, h;
                    stream >> x >> y >> w >> h;
                    placeHolder->topLevelRect = QRect(x, y, w, h);
                } else {
                    int dummy;
                    stream >> item.pos >> item.size >> dummy >> dummy;
                }
                if (item.size != -1)
                    item.flags |= QDockAreaLayoutItem::KeepSize;
                if (!testing)
                    item_list.append(item);
            } else {
                QDockAreaLayoutItem item(new QDockWidgetItem(widget));
                if (flags & StateFlagFloating) {
                    bool drawer = false;

                    if (!testing) {
                        widget->hide();
                        if (!drawer)
                            widget->setFloating(true);
                    }

                    int x, y, w, h;
                    stream >> x >> y >> w >> h;

                    if (!testing)
                        widget->setGeometry(QDockAreaLayout::constrainedRect(QRect(x, y, w, h), widget));

                    if (!testing) {
                        widget->setVisible(flags & StateFlagVisible);
                        item_list.append(item);
                    }
                } else {
                    int dummy;
                    stream >> item.pos >> item.size >> dummy >> dummy;
                    if (!testing) {
                        item_list.append(item);
                        widget->setFloating(false);
                        widget->setVisible(flags & StateFlagVisible);
                        emit widget->dockLocationChanged(toDockWidgetArea(dockPos));
                    }
                }
                if (testing) {
                    //was it is not really added to the layout, we need to delete the object here
                    delete item.widgetItem;
                    item.widgetItem = nullptr;
                }
            }
        } else if (nextMarker == SequenceMarker) {
            int dummy;
#if !QT_CONFIG(tabbar)
            const int tabBarShape = 0;
#endif
            QDockAreaLayoutItem item(new QDockAreaLayoutInfo(sep, dockPos, o,
                                                                tabBarShape, mainWindow));
            stream >> item.pos >> item.size >> dummy >> dummy;
            //we need to make sure the element is in the list so the dock widget can eventually be docked correctly
            if (!testing)
                item_list.append(item);

            //here we need to make sure we change the item in the item_list
            QDockAreaLayoutItem &lastItem = testing ? item : item_list.last();

            if (!lastItem.subinfo->restoreState(stream, widgets, testing))
                return false;

        } else {
            return false;
        }
    }

#if QT_CONFIG(tabbar)
    if (!testing && tabbed && index >= 0 && index < item_list.size()) {
        updateTabBar();
        setCurrentTabId(tabId(item_list.at(index)));
    }
    if (!testing && *sep == 1)
        updateSeparatorWidgets();
#endif

    return true;
}